

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetLinkerTypeProperty
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *lang,string *config)

{
  pointer pbVar1;
  bool bVar2;
  cmValue cVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  first;
  long lVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  long lVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string ltype;
  cmList list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  static_string_view *local_140;
  static_string_view *local_138;
  string local_130;
  string local_110;
  string propName;
  static_string_view DL_END;
  static_string_view DL_BEGIN;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&propName,"LINKER_TYPE",(allocator<char> *)&dagChecker);
  cVar3 = GetProperty(this,&propName);
  if ((cVar3.Value == (string *)0x0) || ((cVar3.Value)->_M_string_length == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    goto LAB_0036acb0;
  }
  std::__cxx11::string::string((string *)&local_110,(string *)&propName);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,this,&local_110,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)&local_130,(string *)cVar3.Value);
  cmGeneratorExpression::Evaluate
            (&ltype,&local_130,this->LocalGenerator,config,this,&dagChecker,this,lang);
  std::__cxx11::string::~string((string *)&local_130);
  if (this->DeviceLink == true) {
    std::__cxx11::string::string((string *)&local_160,(string *)&ltype);
    init._M_len = 1;
    init._M_array = &local_160;
    cmList::cmList(&list,init);
    std::__cxx11::string::~string((string *)&local_160);
    pbVar1 = list.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_160._M_dataplus._M_p = (pointer)&DL_BEGIN;
    DL_BEGIN.super_string_view._M_len = 0xd;
    DL_BEGIN.super_string_view._M_str = "<DEVICE_LINK>";
    local_160._M_string_length = (size_type)&DL_END;
    DL_END.super_string_view._M_len = 0xe;
    DL_END.super_string_view._M_str = "</DEVICE_LINK>";
    lVar6 = (long)list.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)list.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    _Var5._M_current =
         list.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_140 = (static_string_view *)local_160._M_dataplus._M_p;
    local_138 = (static_string_view *)local_160._M_string_length;
    for (lVar4 = lVar6 >> 7; 0 < lVar4; lVar4 = lVar4 + -1) {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
              ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                            *)&local_160,_Var5);
      first._M_current = _Var5._M_current;
      if (bVar2) goto LAB_0036ac33;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
              ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                            *)&local_160,_Var5._M_current + 1);
      first._M_current = _Var5._M_current + 1;
      if (bVar2) goto LAB_0036ac33;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
              ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                            *)&local_160,_Var5._M_current + 2);
      first._M_current = _Var5._M_current + 2;
      if (bVar2) goto LAB_0036ac33;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
              ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                            *)&local_160,_Var5._M_current + 3);
      first._M_current = _Var5._M_current + 3;
      if (bVar2) goto LAB_0036ac33;
      _Var5._M_current = _Var5._M_current + 4;
      lVar6 = lVar6 + -0x80;
    }
    lVar6 = lVar6 >> 5;
    if (lVar6 == 1) {
LAB_0036ac13:
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
              ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                            *)&local_160,_Var5);
      first._M_current = _Var5._M_current;
      if (!bVar2) {
        first._M_current = pbVar1;
      }
LAB_0036ac33:
      if (first._M_current != pbVar1) {
        _Var5._M_current = first._M_current;
        while (_Var5._M_current = _Var5._M_current + 1, _Var5._M_current != pbVar1) {
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                  ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                                *)&local_140,_Var5);
          if (!bVar2) {
            std::__cxx11::string::operator=((string *)first._M_current,(string *)_Var5._M_current);
            first._M_current = first._M_current + 1;
          }
        }
      }
    }
    else {
      if (lVar6 == 2) {
LAB_0036abfe:
        bVar2 = __gnu_cxx::__ops::
                _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                              *)&local_160,_Var5);
        first._M_current = _Var5._M_current;
        if (!bVar2) {
          _Var5._M_current = _Var5._M_current + 1;
          goto LAB_0036ac13;
        }
        goto LAB_0036ac33;
      }
      first._M_current = pbVar1;
      if (lVar6 == 3) {
        bVar2 = __gnu_cxx::__ops::
                _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                              *)&local_160,_Var5);
        first._M_current = _Var5._M_current;
        if (!bVar2) {
          _Var5._M_current = _Var5._M_current + 1;
          goto LAB_0036abfe;
        }
        goto LAB_0036ac33;
      }
    }
    cmList::erase(&list,(const_iterator)first._M_current,
                  (const_iterator)
                  list.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
    cmList::to_string_abi_cxx11_(__return_storage_ptr__,&list);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&list.Values);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ltype._M_dataplus._M_p == &ltype.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(ltype.field_2._M_allocated_capacity._1_7_,ltype.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = ltype.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = ltype._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(ltype.field_2._M_allocated_capacity._1_7_,ltype.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = ltype._M_string_length;
    ltype._M_string_length = 0;
    ltype.field_2._M_local_buf[0] = '\0';
    ltype._M_dataplus._M_p = (pointer)&ltype.field_2;
  }
  std::__cxx11::string::~string((string *)&ltype);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
LAB_0036acb0:
  std::__cxx11::string::~string((string *)&propName);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetLinkerTypeProperty(
  std::string const& lang, std::string const& config) const
{
  std::string propName{ "LINKER_TYPE" };
  auto linkerType = this->GetProperty(propName);
  if (!linkerType.IsEmpty()) {
    cmGeneratorExpressionDAGChecker dagChecker(this, propName, nullptr,
                                               nullptr);
    auto ltype =
      cmGeneratorExpression::Evaluate(*linkerType, this->GetLocalGenerator(),
                                      config, this, &dagChecker, this, lang);
    if (this->IsDeviceLink()) {
      cmList list{ ltype };
      const auto DL_BEGIN = "<DEVICE_LINK>"_s;
      const auto DL_END = "</DEVICE_LINK>"_s;
      cm::erase_if(list, [&](const std::string& item) {
        return item == DL_BEGIN || item == DL_END;
      });
      return list.to_string();
    }
    return ltype;
  }
  return std::string{};
}